

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_mem_manager.cpp
# Opt level: O0

bool __thiscall SharedMemoryManager::RemoveShMem(SharedMemoryManager *this)

{
  int iVar1;
  long in_RDI;
  undefined1 local_1;
  
  if (*(int *)(in_RDI + 0x18) < 1) {
    iVar1 = shmctl(*(int *)(in_RDI + 4),0,(shmid_ds *)0x0);
    if (iVar1 == -1) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SharedMemoryManager::RemoveShMem()
{            
    if(total_attached_ > 0 ) {
        DEBUG_ELOG("Error : attached exists :" <<total_attached_ );
		return false;
    }
    if (shmctl(sh_mem_id_, IPC_RMID, (struct shmid_ds *)NULL) == -1) {
        DEBUG_ELOG("Remove shared memoey error: "<< strerror(errno) );
		return false;
    }
    return true;
}